

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_info.cc
# Opt level: O3

void __thiscall pstack::Dwarf::Abbreviation::Abbreviation(Abbreviation *this,DWARFReader *r)

{
  element_type *peVar1;
  Tag TVar2;
  int iVar3;
  undefined4 extraout_var;
  long extraout_RDX;
  Off offset;
  long extraout_RDX_00;
  Off OVar4;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long local_50;
  intmax_t value;
  uchar uStack_40;
  Form form;
  uchar q;
  AttrName local_34 [2];
  AttrName name;
  
  peVar1 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  TVar2 = (*peVar1->_vptr_Reader[3])(peVar1,r->off);
  offset = extraout_RDX + r->off;
  r->off = offset;
  this->tag = TVar2;
  Reader::readObj<unsigned_char>
            ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             offset,&stack0xffffffffffffffc0,1);
  r->off = r->off + 1;
  this->hasChildren = uStack_40 == '\x01';
  this->sorted = false;
  (this->forms).
  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forms).
  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _uStack_40 = 0;
  (this->forms).
  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nextSibIdx = -1;
  (this->attrName2Idx).
  super__Vector_base<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attrName2Idx).
  super__Vector_base<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attrName2Idx).
  super__Vector_base<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    peVar1 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_34[0] = (*peVar1->_vptr_Reader[3])(peVar1,r->off);
    OVar4 = extraout_RDX_00 + r->off;
    r->off = OVar4;
    peVar1 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    value._4_4_ = (*peVar1->_vptr_Reader[3])(peVar1,OVar4);
    OVar4 = extraout_RDX_01 + r->off;
    r->off = OVar4;
    if (local_34[0] == DW_AT_none && value._4_4_ == 0) break;
    if (local_34[0] == DW_AT_sibling) {
      this->nextSibIdx = _uStack_40;
    }
    if (value._4_4_ == 0x21) {
      peVar1 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar3 = (*peVar1->_vptr_Reader[4])(peVar1,OVar4);
      local_50 = CONCAT44(extraout_var,iVar3);
      r->off = r->off + extraout_RDX_02;
    }
    else {
      local_50 = 0;
    }
    std::vector<pstack::Dwarf::FormEntry,std::allocator<pstack::Dwarf::FormEntry>>::
    emplace_back<pstack::Dwarf::Form&,long&>
              ((vector<pstack::Dwarf::FormEntry,std::allocator<pstack::Dwarf::FormEntry>> *)
               &this->forms,(Form *)((long)&value + 4),&local_50);
    std::
    vector<std::pair<pstack::Dwarf::AttrName,unsigned_long>,std::allocator<std::pair<pstack::Dwarf::AttrName,unsigned_long>>>
    ::emplace_back<pstack::Dwarf::AttrName&,unsigned_long&>
              ((vector<std::pair<pstack::Dwarf::AttrName,unsigned_long>,std::allocator<std::pair<pstack::Dwarf::AttrName,unsigned_long>>>
                *)&this->attrName2Idx,local_34,(unsigned_long *)&stack0xffffffffffffffc0);
    _uStack_40 = _uStack_40 + 1;
  }
  return;
}

Assistant:

Abbreviation::Abbreviation(DWARFReader &r)
    : tag(Tag(r.getuleb128()))
    , hasChildren(HasChildren(r.getu8()) == DW_CHILDREN_yes)
    , sorted(false)
    , nextSibIdx(-1)
{
    for (size_t i = 0;; ++i) {
        auto name = AttrName(r.getuleb128());
        auto form = Form(r.getuleb128());
        if (name == 0 && form == 0)
            break;
        if (name == DW_AT_sibling)
            nextSibIdx = int(i);
        intmax_t value = (form == DW_FORM_implicit_const) ? r.getsleb128() : 0;
        forms.emplace_back(form, value);
        attrName2Idx.emplace_back(name, i);
    }
}